

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  uint uVar1;
  float *pfVar2;
  long *in_RSI;
  Mat *in_RDI;
  float *ptr;
  int len;
  bool is_array;
  int nread;
  int id;
  ParamDict *in_stack_00000030;
  int iVar3;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  Mat *this_00;
  
  this_00 = in_RDI;
  clear(in_stack_00000030);
  iVar4 = 0;
  uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffe4,4);
  if (uVar1 == 4) {
    do {
      if (iVar4 == -0xe9) {
        return 0;
      }
      in_stack_ffffffffffffffdc = CONCAT13(iVar4 < -0x5b03,(int3)in_stack_ffffffffffffffdc);
      if (iVar4 < -0x5b03) {
        iVar4 = -0x5b04 - iVar4;
        iVar3 = 0;
        uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffd8,4);
        if (uVar1 != 4) {
          fprintf(_stderr,"ParamDict read array length failed %d\n",(ulong)uVar1);
          return -1;
        }
        Mat::create(this_00,(int)((ulong)in_RSI >> 0x20),CONCAT44(iVar4,4),
                    (Allocator *)CONCAT44(in_stack_ffffffffffffffdc,iVar3));
        pfVar2 = Mat::operator_cast_to_float_((Mat *)((long)in_RDI + (long)iVar4 * 0x48 + 8));
        uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,pfVar2,((long)iVar3 & 0x3fffffffU) << 2);
        if (uVar1 != iVar3 << 2) {
          fprintf(_stderr,"ParamDict read array element failed %d\n",(ulong)uVar1);
          return -1;
        }
        *(undefined4 *)((long)in_RDI + (long)iVar4 * 0x48) = 4;
      }
      else {
        uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,(long)in_RDI + (long)iVar4 * 0x48 + 4,4);
        if (uVar1 != 4) {
          fprintf(_stderr,"ParamDict read value failed %d\n",(ulong)uVar1);
          return -1;
        }
        *(undefined4 *)((long)in_RDI + (long)iVar4 * 0x48) = 1;
      }
      uVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffe4,4);
    } while (uVar1 == 4);
    fprintf(_stderr,"ParamDict read EOP failed %d\n",(ulong)uVar1);
  }
  else {
    fprintf(_stderr,"ParamDict read id failed %d\n",(ulong)uVar1);
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    int nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != (int)sizeof(int))
    {
        fprintf(stderr, "ParamDict read id failed %d\n", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != (int)sizeof(int))
            {
                fprintf(stderr, "ParamDict read array length failed %d\n", nread);
                return -1;
            }

            params[id].v.create(len);

            float* ptr = params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != (int)sizeof(float) * len)
            {
                fprintf(stderr, "ParamDict read array element failed %d\n", nread);
                return -1;
            }

            params[id].type = 4;
        }
        else
        {
            nread = dr.read(&params[id].f, sizeof(float));
            if (nread != (int)sizeof(float))
            {
                fprintf(stderr, "ParamDict read value failed %d\n", nread);
                return -1;
            }

            params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != (int)sizeof(int))
        {
            fprintf(stderr, "ParamDict read EOP failed %d\n", nread);
            return -1;
        }
    }

    return 0;
}